

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O0

void Aig_ManRegPartitionTraverse_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vLos)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  Vec_Ptr_t *vLos_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Aig_ObjIsCi(pObj);
    if (iVar1 == 0) {
      pAVar4 = Aig_ObjFanin0(pObj);
      Aig_ManRegPartitionTraverse_rec(p,pAVar4,vLos);
      pAVar4 = Aig_ObjFanin1(pObj);
      Aig_ManRegPartitionTraverse_rec(p,pAVar4,vLos);
    }
    else {
      iVar1 = (pObj->field_5).iData;
      iVar2 = Aig_ManCiNum(p);
      iVar3 = Aig_ManRegNum(p);
      if (iVar2 - iVar3 <= iVar1) {
        Vec_PtrPush(vLos,pObj);
        iVar1 = (pObj->field_5).iData;
        iVar2 = Aig_ManCiNum(p);
        iVar3 = Aig_ManRegNum(p);
        printf("%d ",(ulong)(uint)(iVar1 - (iVar2 - iVar3)));
      }
    }
  }
  return;
}

Assistant:

void Aig_ManRegPartitionTraverse_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vLos )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent( p, pObj );
    if ( Aig_ObjIsCi(pObj) )
    {
        if ( pObj->iData >= Aig_ManCiNum(p) - Aig_ManRegNum(p) )
        {
            Vec_PtrPush( vLos, pObj );
            printf( "%d ", pObj->iData - (Aig_ManCiNum(p) - Aig_ManRegNum(p)) );
        }
        return;
    }
    Aig_ManRegPartitionTraverse_rec( p, Aig_ObjFanin0(pObj), vLos );
    Aig_ManRegPartitionTraverse_rec( p, Aig_ObjFanin1(pObj), vLos );
}